

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bpattern(bstring b,int len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  if (b == (bstring)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    if (0 < b->slen) {
      uVar4 = b->slen;
    }
  }
  iVar2 = -1;
  if ((-1 < len && uVar4 != 0) && (iVar1 = balloc(b,len + 1), iVar1 == 0)) {
    if (0 < len) {
      if (uVar4 == 1) {
        iVar2 = bsetstr(b,len,(bstring)0x0,*b->data);
        return iVar2;
      }
      if ((int)uVar4 < len) {
        lVar3 = 0;
        do {
          b->data[(ulong)uVar4 + lVar3] = b->data[lVar3];
          lVar3 = lVar3 + 1;
        } while (((ulong)uVar4 - (ulong)(uint)len) + lVar3 != 0);
      }
    }
    b->data[(uint)len] = '\0';
    b->slen = len;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bpattern (bstring b, int len) {
int i, d;

	d = blength (b);
	if (d <= 0 || len < 0 || balloc (b, len + 1) != BSTR_OK) return BSTR_ERR;
	if (len > 0) {
		if (d == 1) return bsetstr (b, len, NULL, b->data[0]);
		for (i = d; i < len; i++) b->data[i] = b->data[i - d];
	}
	b->data[len] = (unsigned char) '\0';
	b->slen = len;
	return 0;
}